

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int set_directory_record
              (uchar *p,size_t n,isoent *isoent,iso9660_conflict *iso9660,dir_rec_type t,
              vdd_type vdd_type)

{
  time_t t_00;
  uchar local_61;
  isofile *piStack_60;
  uchar flag;
  isofile *file;
  isoent *xisoent;
  size_t fi_len;
  size_t dr_len;
  uchar *bp;
  vdd_type vdd_type_local;
  dir_rec_type t_local;
  iso9660_conflict *iso9660_local;
  isoent *isoent_local;
  size_t n_local;
  uchar *p_local;
  
  if (p != (uchar *)0x0) {
    switch(t) {
    case DIR_REC_VD:
      fi_len = (size_t)(isoent->dr_len).vd;
      break;
    case DIR_REC_SELF:
      fi_len = (size_t)(isoent->dr_len).self;
      break;
    case DIR_REC_PARENT:
      fi_len = (size_t)(isoent->dr_len).parent;
      break;
    case DIR_REC_NORMAL:
    default:
      fi_len = (size_t)(isoent->dr_len).normal;
    }
    if (n < fi_len) {
      return 0;
    }
  }
  if ((t == DIR_REC_NORMAL) && (isoent->identifier != (char *)0x0)) {
    xisoent = (isoent *)(long)isoent->id_len;
  }
  else {
    xisoent = (isoent *)0x1;
  }
  if (p == (uchar *)0x0) {
    dr_len = 0;
  }
  else {
    file = (isofile *)isoent;
    if (t == DIR_REC_PARENT) {
      file = (isofile *)isoent->parent;
    }
    piStack_60 = isoent->file;
    if (piStack_60->hardlink_target != (isofile *)0x0) {
      piStack_60 = piStack_60->hardlink_target;
    }
    if ((*(byte *)&file[1].entry >> 1 & 1) == 0) {
      if (piStack_60->cur_content->next == (content_conflict *)0x0) {
        local_61 = '\0';
      }
      else {
        local_61 = 0x80;
      }
    }
    else {
      local_61 = '\x02';
    }
    dr_len = (size_t)(p + -1);
    set_num_711(p + 1,'\0');
    if ((*(byte *)&file[1].entry >> 1 & 1) == 0) {
      set_num_733(p + 2,piStack_60->cur_content->location);
    }
    else {
      set_num_733(p + 2,*(uint32_t *)((long)&(file->content).size + 4));
    }
    if ((*(byte *)&file[1].entry >> 1 & 1) == 0) {
      set_num_733(p + 10,(uint32_t)piStack_60->cur_content->size);
    }
    else {
      set_num_733(p + 10,(file->content).blocks << 0xb);
    }
    t_00 = archive_entry_mtime(file->hardlink_target->entry);
    set_time_915(p + 0x12,t_00);
    p[0x19] = local_61;
    set_num_711(p + 0x1a,'\0');
    set_num_711(p + 0x1b,'\0');
    set_num_723(p + 0x1c,(uint16_t)iso9660->volume_sequence_number);
    set_num_711(p + 0x20,(uchar)xisoent);
    if (t < DIR_REC_PARENT) {
      set_num_711(p + 0x21,'\0');
    }
    else if (t == DIR_REC_PARENT) {
      set_num_711(p + 0x21,'\x01');
    }
    else if (t == DIR_REC_NORMAL) {
      if (isoent->identifier == (char *)0x0) {
        set_num_711(p + 0x21,'\0');
      }
      else {
        memcpy(p + 0x21,isoent->identifier,(size_t)xisoent);
      }
    }
  }
  fi_len = (long)&xisoent->parent + 1;
  if (((fi_len & 1) != 0) && (fi_len = (long)&xisoent->parent + 2, p != (uchar *)0x0)) {
    *(undefined1 *)(fi_len + dr_len) = 0;
  }
  p_local._4_4_ = (int)fi_len;
  if (t == DIR_REC_VD) {
    if (p == (uchar *)0x0) {
      (isoent->dr_len).vd = p_local._4_4_;
    }
    else {
      set_num_711(p,(uchar)fi_len);
    }
  }
  else {
    fi_len._0_4_ = p_local._4_4_;
    if ((((uint)iso9660->opt >> 0x17 & 3) != 0) && (vdd_type != VDD_JOLIET)) {
      fi_len._0_4_ = set_directory_record_rr((uchar *)dr_len,p_local._4_4_,isoent,iso9660,t);
    }
    p_local._4_4_ = (int)fi_len;
    if (p == (uchar *)0x0) {
      switch(t) {
      case DIR_REC_VD:
        break;
      case DIR_REC_SELF:
        (isoent->dr_len).self = (int)fi_len;
        break;
      case DIR_REC_PARENT:
        (isoent->dr_len).parent = (int)fi_len;
        break;
      case DIR_REC_NORMAL:
        (isoent->dr_len).normal = (int)fi_len;
      }
    }
    else {
      set_num_711(p,(uchar)(int)fi_len);
    }
  }
  return p_local._4_4_;
}

Assistant:

static int
set_directory_record(unsigned char *p, size_t n, struct isoent *isoent,
    struct iso9660 *iso9660, enum dir_rec_type t,
    enum vdd_type vdd_type)
{
	unsigned char *bp;
	size_t dr_len;
	size_t fi_len;

	if (p != NULL) {
		/*
		 * Check whether a write buffer size is less than the
		 * saved size which is needed to write this Directory
		 * Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			dr_len = isoent->dr_len.vd; break;
		case DIR_REC_SELF:
			dr_len = isoent->dr_len.self; break;
		case DIR_REC_PARENT:
			dr_len = isoent->dr_len.parent; break;
		case DIR_REC_NORMAL:
		default:
			dr_len = isoent->dr_len.normal; break;
		}
		if (dr_len > n)
			return (0);/* Needs more buffer size. */
	}

	if (t == DIR_REC_NORMAL && isoent->identifier != NULL)
		fi_len = isoent->id_len;
	else
		fi_len = 1;

	if (p != NULL) {
		struct isoent *xisoent;
		struct isofile *file;
		unsigned char flag;

		if (t == DIR_REC_PARENT)
			xisoent = isoent->parent;
		else
			xisoent = isoent;
		file = isoent->file;
		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		/* Make a file flag. */
		if (xisoent->dir)
			flag = FILE_FLAG_DIRECTORY;
		else {
			if (file->cur_content->next != NULL)
				flag = FILE_FLAG_MULTI_EXTENT;
			else
				flag = 0;
		}

		bp = p -1;
		/* Extended Attribute Record Length */
		set_num_711(bp+2, 0);
		/* Location of Extent */
		if (xisoent->dir)
			set_num_733(bp+3, xisoent->dir_location);
		else
			set_num_733(bp+3, file->cur_content->location);
		/* Data Length */
		if (xisoent->dir)
			set_num_733(bp+11,
			    xisoent->dir_block * LOGICAL_BLOCK_SIZE);
		else
			set_num_733(bp+11, (uint32_t)file->cur_content->size);
		/* Recording Date and Time */
		/* NOTE:
		 *  If a file type is symbolic link, you are seeing this
		 *  field value is different from a value mkisofs makes.
		 *  libarchive uses lstat to get this one, but it
		 *  seems mkisofs uses stat to get.
		 */
		set_time_915(bp+19,
		    archive_entry_mtime(xisoent->file->entry));
		/* File Flags */
		bp[26] = flag;
		/* File Unit Size */
		set_num_711(bp+27, 0);
		/* Interleave Gap Size */
		set_num_711(bp+28, 0);
		/* Volume Sequence Number */
		set_num_723(bp+29, iso9660->volume_sequence_number);
		/* Length of File Identifier */
		set_num_711(bp+33, (unsigned char)fi_len);
		/* File Identifier */
		switch (t) {
		case DIR_REC_VD:
		case DIR_REC_SELF:
			set_num_711(bp+34, 0);
			break;
		case DIR_REC_PARENT:
			set_num_711(bp+34, 1);
			break;
		case DIR_REC_NORMAL:
			if (isoent->identifier != NULL)
				memcpy(bp+34, isoent->identifier, fi_len);
			else
				set_num_711(bp+34, 0);
			break;
		}
	} else
		bp = NULL;
	dr_len = 33 + fi_len;
	/* Padding Field */
	if (dr_len & 0x01) {
		dr_len ++;
		if (p != NULL)
			bp[dr_len] = 0;
	}

	/* Volume Descriptor does not record extension. */
	if (t == DIR_REC_VD) {
		if (p != NULL)
			/* Length of Directory Record */
			set_num_711(p, (unsigned char)dr_len);
		else
			isoent->dr_len.vd = (int)dr_len;
		return ((int)dr_len);
	}

	/* Rockridge */
	if (iso9660->opt.rr && vdd_type != VDD_JOLIET)
		dr_len = set_directory_record_rr(bp, (int)dr_len,
		    isoent, iso9660, t);

	if (p != NULL)
		/* Length of Directory Record */
		set_num_711(p, (unsigned char)dr_len);
	else {
		/*
		 * Save the size which is needed to write this
		 * Directory Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			/* This case does not come, but compiler
			 * complains that DIR_REC_VD not handled
			 *  in switch ....  */
			break;
		case DIR_REC_SELF:
			isoent->dr_len.self = (int)dr_len; break;
		case DIR_REC_PARENT:
			isoent->dr_len.parent = (int)dr_len; break;
		case DIR_REC_NORMAL:
			isoent->dr_len.normal = (int)dr_len; break;
		}
	}

	return ((int)dr_len);
}